

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_block_instructions(CompilerGLSL *this,SPIRBlock *block)

{
  uint32_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t sVar5;
  Phi *pPVar6;
  pointer ppVar7;
  Instruction *pIVar8;
  uint32_t local_11c;
  undefined1 local_118 [8];
  EmbeddedInstruction inst_1;
  TemporaryCopy temporary_copy;
  Instruction *op;
  Instruction *__end1;
  Instruction *__begin1;
  SmallVector<spirv_cross::Instruction,_8UL> *__range1;
  uint32_t local_94;
  undefined1 local_90 [8];
  EmbeddedInstruction inst;
  uint32_t local_3c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_38;
  iterator itr;
  Phi *phi;
  size_t n;
  size_t i;
  SPIRBlock *block_local;
  CompilerGLSL *this_local;
  
  this->current_emitting_block = block;
  if (((this->backend).requires_relaxed_precision_analysis & 1U) != 0) {
    n = 0;
    sVar5 = VectorView<spirv_cross::SPIRBlock::Phi>::size
                      (&(block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
    for (; n < sVar5; n = n + 1) {
      itr.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
           VectorView<spirv_cross::SPIRBlock::Phi>::operator[]
                     (&(block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>,n);
      if (n == 0) {
LAB_00398717:
        local_3c = TypedID::operator_cast_to_unsigned_int
                             ((TypedID *)
                              ((long)itr.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                     ._M_cur + 8));
        local_38._M_cur =
             (__node_type *)
             ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find(&this->temporary_to_mirror_precision_alias,&local_3c);
        inst.ops.stack_storage.aligned_char._24_8_ =
             ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::end(&this->temporary_to_mirror_precision_alias);
        bVar2 = ::std::__detail::operator!=
                          (&local_38,
                           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            *)(inst.ops.stack_storage.aligned_char + 0x18));
        if (bVar2) {
          EmbeddedInstruction::EmbeddedInstruction((EmbeddedInstruction *)local_90);
          local_90._0_2_ = 0x53;
          inst.super_Instruction.op = 3;
          inst.super_Instruction.count = 0;
          ppVar7 = ::std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                   operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                               *)&local_38);
          local_94 = Compiler::expression_type_id(&this->super_Compiler,ppVar7->first);
          SmallVector<unsigned_int,_8UL>::push_back
                    ((SmallVector<unsigned_int,_8UL> *)&inst.super_Instruction.length,&local_94);
          puVar1 = &inst.super_Instruction.length;
          ppVar7 = ::std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                   operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                               *)&local_38);
          SmallVector<unsigned_int,_8UL>::push_back
                    ((SmallVector<unsigned_int,_8UL> *)puVar1,&ppVar7->second);
          ppVar7 = ::std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                   operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                               *)&local_38);
          SmallVector<unsigned_int,_8UL>::push_back
                    ((SmallVector<unsigned_int,_8UL> *)puVar1,&ppVar7->first);
          (*(this->super_Compiler)._vptr_Compiler[8])(this,local_90);
          EmbeddedInstruction::~EmbeddedInstruction((EmbeddedInstruction *)local_90);
        }
      }
      else {
        pPVar6 = VectorView<spirv_cross::SPIRBlock::Phi>::operator[]
                           (&(block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>,
                            n - 1);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pPVar6->function_variable);
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)
                           ((long)itr.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                  ._M_cur + 8));
        if (uVar3 != uVar4) goto LAB_00398717;
      }
    }
  }
  __end1 = VectorView<spirv_cross::Instruction>::begin
                     (&(block->ops).super_VectorView<spirv_cross::Instruction>);
  pIVar8 = VectorView<spirv_cross::Instruction>::end
                     (&(block->ops).super_VectorView<spirv_cross::Instruction>);
  for (; __end1 != pIVar8; __end1 = __end1 + 1) {
    inst_1.ops.stack_storage.aligned_char._24_8_ = handle_instruction_precision(this,__end1);
    (*(this->super_Compiler)._vptr_Compiler[8])(this,__end1);
    if (inst_1.ops.stack_storage.aligned_char._24_4_ != 0) {
      EmbeddedInstruction::EmbeddedInstruction((EmbeddedInstruction *)local_118);
      local_118._0_2_ = 0x53;
      inst_1.super_Instruction.op = 3;
      inst_1.super_Instruction.count = 0;
      local_11c = Compiler::expression_type_id
                            (&this->super_Compiler,inst_1.ops.stack_storage.aligned_char._28_4_);
      SmallVector<unsigned_int,_8UL>::push_back
                ((SmallVector<unsigned_int,_8UL> *)&inst_1.super_Instruction.length,&local_11c);
      puVar1 = &inst_1.super_Instruction.length;
      SmallVector<unsigned_int,_8UL>::push_back
                ((SmallVector<unsigned_int,_8UL> *)puVar1,
                 (uint *)(inst_1.ops.stack_storage.aligned_char + 0x18));
      SmallVector<unsigned_int,_8UL>::push_back
                ((SmallVector<unsigned_int,_8UL> *)puVar1,
                 (uint *)(inst_1.ops.stack_storage.aligned_char + 0x1c));
      this->block_temporary_hoisting = true;
      (*(this->super_Compiler)._vptr_Compiler[8])(this,local_118);
      this->block_temporary_hoisting = false;
      EmbeddedInstruction::~EmbeddedInstruction((EmbeddedInstruction *)local_118);
    }
  }
  this->current_emitting_block = (SPIRBlock *)0x0;
  return;
}

Assistant:

void CompilerGLSL::emit_block_instructions(SPIRBlock &block)
{
	current_emitting_block = &block;

	if (backend.requires_relaxed_precision_analysis)
	{
		// If PHI variables are consumed in unexpected precision contexts, copy them here.
		for (size_t i = 0, n = block.phi_variables.size(); i < n; i++)
		{
			auto &phi = block.phi_variables[i];

			// Ensure we only copy once. We know a-priori that this array will lay out
			// the same function variables together.
			if (i && block.phi_variables[i - 1].function_variable == phi.function_variable)
				continue;

			auto itr = temporary_to_mirror_precision_alias.find(phi.function_variable);
			if (itr != temporary_to_mirror_precision_alias.end())
			{
				// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
				// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
				EmbeddedInstruction inst;
				inst.op = OpCopyObject;
				inst.length = 3;
				inst.ops.push_back(expression_type_id(itr->first));
				inst.ops.push_back(itr->second);
				inst.ops.push_back(itr->first);
				emit_instruction(inst);
			}
		}
	}

	for (auto &op : block.ops)
	{
		auto temporary_copy = handle_instruction_precision(op);
		emit_instruction(op);
		if (temporary_copy.dst_id)
		{
			// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
			// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
			EmbeddedInstruction inst;
			inst.op = OpCopyObject;
			inst.length = 3;
			inst.ops.push_back(expression_type_id(temporary_copy.src_id));
			inst.ops.push_back(temporary_copy.dst_id);
			inst.ops.push_back(temporary_copy.src_id);

			// Never attempt to hoist mirrored temporaries.
			// They are hoisted in lock-step with their parents.
			block_temporary_hoisting = true;
			emit_instruction(inst);
			block_temporary_hoisting = false;
		}
	}

	current_emitting_block = nullptr;
}